

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

bool __thiscall
pstore::json::details::string_matcher<json_out_callbacks>::appender::append16
          (appender *this,char16_t cu)

{
  uint uVar1;
  uint uVar2;
  char32_t c;
  
  uVar2 = (uint)(ushort)cu;
  uVar1 = (uint)(ushort)this->high_surrogate_;
  if ((uVar2 & 0xfc00) == 0xdc00) {
    c = (char32_t)(ushort)this->high_surrogate_;
    if (c == L'\0') {
      return false;
    }
    if (((c & 0xfc00U) == 0xd800) && (c = L'�', 0xfbff < (uVar2 + 0x2000 & 0xffff))) {
      c = (uVar1 & 0x3ff) * 0x400 + (uVar2 & 0x3ff) + L'𐀀';
    }
    utf::code_point_to_utf8<char,std::back_insert_iterator<std::__cxx11::string>>
              (c,(this->result_).ptr_);
    this->high_surrogate_ = L'\0';
  }
  else if ((uVar2 & 0xfc00) == 0xd800) {
    if (uVar1 != 0) {
      return false;
    }
    this->high_surrogate_ = cu;
  }
  else {
    if (uVar1 != 0) {
      return false;
    }
    utf::code_point_to_utf8<char,std::back_insert_iterator<std::__cxx11::string>>
              ((uint)(ushort)cu,(this->result_).ptr_);
  }
  return true;
}

Assistant:

bool string_matcher<Callbacks>::appender::append16 (char16_t const cu) {
                bool ok = true;
                if (utf::is_utf16_high_surrogate (cu)) {
                    if (!this->has_high_surrogate ()) {
                        high_surrogate_ = cu;
                    } else {
                        // A high surrogate following another high surrogate.
                        ok = false;
                    }
                } else if (utf::is_utf16_low_surrogate (cu)) {
                    if (!this->has_high_surrogate ()) {
                        // A low surrogate following by something other than a high surrogate.
                        ok = false;
                    } else {
                        char16_t const surrogates[] = {high_surrogate_, cu};
                        auto first = std::begin (surrogates);
                        auto const last = std::end (surrogates);
                        auto code_point = char32_t{0};
                        std::tie (first, code_point) =
                            utf::utf16_to_code_point (first, last, utf::nop_swapper);
                        utf::code_point_to_utf8 (code_point, std::back_inserter (*result_));
                        high_surrogate_ = 0;
                    }
                } else {
                    if (this->has_high_surrogate ()) {
                        // A high surrogate followed by something other than a low surrogate.
                        ok = false;
                    } else {
                        auto const code_point = static_cast<char32_t> (cu);
                        utf::code_point_to_utf8 (code_point, std::back_inserter (*result_));
                    }
                }
                return ok;
            }